

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

wchar_t header_pax_extensions
                  (archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  archive_string *as;
  byte bVar1;
  wchar_t wVar2;
  int iVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  uint uVar6;
  size_t sVar7;
  int64_t iVar8;
  byte *pbVar9;
  dev_t dVar10;
  long lVar11;
  archive_string_conv *sc;
  archive_string *paVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  char *pcVar16;
  byte *pbVar17;
  byte bVar18;
  byte *pbVar19;
  byte *pbVar20;
  size_t sVar21;
  byte *pbVar22;
  ulong uVar23;
  bool bVar24;
  wchar_t local_b4;
  byte *local_88;
  long local_68;
  int64_t s;
  byte *local_58;
  int64_t *local_50;
  archive_string *local_48;
  byte *local_40;
  archive_string *local_38;
  
  wVar2 = read_body_to_string(a,(tar *)&tar->pax_header,(archive_string *)h,unconsumed,unconsumed);
  if (wVar2 != L'\0') {
    return wVar2;
  }
  wVar2 = tar_read_header(a,tar,entry,unconsumed);
  if ((wVar2 != L'\0') && (wVar2 != L'\xffffffec')) {
    return wVar2;
  }
  pbVar19 = (byte *)(tar->pax_header).s;
  uVar14 = (tar->pax_header).length;
  tar->pax_hdrcharset_binary = 0;
  paVar12 = &tar->entry_gname;
  (tar->entry_gname).length = 0;
  as = &tar->entry_linkpath;
  (tar->entry_linkpath).length = 0;
  (tar->entry_pathname).length = 0;
  local_38 = &tar->entry_pathname_override;
  (tar->entry_pathname_override).length = 0;
  local_48 = &tar->entry_uname;
  (tar->entry_uname).length = 0;
  local_50 = &tar->sparse_offset;
  local_b4 = L'\0';
LAB_00156220:
  if (uVar14 == 0) goto LAB_00157215;
  uVar23 = 0;
  uVar13 = uVar14;
  pbVar9 = pbVar19;
  while( true ) {
    bVar24 = uVar13 == 0;
    uVar13 = uVar13 - 1;
    pbVar17 = pbVar19 + uVar14;
    if ((bVar24) || (bVar18 = *pbVar9, pbVar17 = pbVar9 + 1, bVar18 == 0x20)) break;
    if ((byte)(bVar18 - 0x3a) < 0xf6) {
      pcVar16 = "Ignoring malformed pax extended attributes";
      goto LAB_001571df;
    }
    uVar23 = (ulong)(byte)(bVar18 - 0x30) + uVar23 * 10;
    pbVar9 = pbVar9 + 1;
    if (999999 < uVar23) {
      pcVar16 = "Rejecting pax extended attribute > 1MB";
      goto LAB_001571df;
    }
  }
  uVar13 = uVar23 - 1;
  if ((uVar14 <= uVar13) || (pbVar19[uVar13] != 10)) {
    pcVar16 = "Ignoring malformed pax extended attribute";
LAB_001571df:
    archive_set_error(&a->archive,-1,pcVar16);
    local_b4 = L'\xffffffec';
    goto LAB_001571e9;
  }
  pbVar19[uVar13] = 0;
  bVar18 = *pbVar17;
  if (bVar18 == 0x3d) {
    local_b4 = L'\xffffffff';
    goto LAB_001571e9;
  }
  pbVar20 = pbVar19 + (uVar23 - (long)pbVar17) + -2;
  pbVar9 = pbVar17;
  while( true ) {
    pbVar22 = pbVar9 + 1;
    if (bVar18 == 0) {
      pcVar16 = "Invalid pax extended attributes";
      goto LAB_001571df;
    }
    if (bVar18 == 0x3d) break;
    bVar18 = *pbVar22;
    pbVar20 = pbVar20 + -1;
    pbVar9 = pbVar22;
  }
  *pbVar9 = 0;
  bVar18 = *pbVar17;
  wVar4 = L'\0';
  switch(bVar18) {
  case 0x61:
    iVar3 = strcmp((char *)pbVar17,"atime");
    if (iVar3 == 0) {
      pax_time((char *)pbVar22,&s,&local_68);
      archive_entry_set_atime(entry,s,local_68);
    }
    break;
  case 0x62:
  case 100:
  case 0x65:
  case 0x66:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x6f:
  case 0x71:
  case 0x72:
  case 0x74:
switchD_00156318_caseD_62:
    goto LAB_00156e91;
  case 99:
    iVar3 = strcmp((char *)pbVar17,"ctime");
    if (iVar3 == 0) {
      pax_time((char *)pbVar22,&s,&local_68);
      archive_entry_set_ctime(entry,s,local_68);
    }
    break;
  case 0x67:
    iVar3 = strcmp((char *)pbVar17,"gid");
    if (iVar3 == 0) {
      sVar7 = strlen((char *)pbVar22);
      iVar8 = tar_atol10((char *)pbVar22,sVar7);
      archive_entry_set_gid(entry,iVar8);
    }
    else {
      iVar3 = strcmp((char *)pbVar17,"gname");
      if (iVar3 == 0) {
        (tar->entry_gname).length = 0;
        sVar7 = strlen((char *)pbVar22);
        archive_strncat(paVar12,pbVar22,sVar7);
      }
    }
    goto LAB_00156d17;
  case 0x68:
    iVar3 = strcmp((char *)pbVar17,"hdrcharset");
    if (iVar3 == 0) {
      iVar3 = strcmp((char *)pbVar22,"BINARY");
      if (iVar3 == 0) {
        tar->pax_hdrcharset_binary = 1;
      }
      else {
        iVar3 = strcmp((char *)pbVar22,"ISO-IR 10646 2000 UTF-8");
        if (iVar3 == 0) {
          tar->pax_hdrcharset_binary = 0;
        }
      }
    }
    break;
  case 0x6c:
    iVar3 = strcmp((char *)pbVar17,"linkpath");
    if (iVar3 == 0) {
      (tar->entry_linkpath).length = 0;
      sVar7 = strlen((char *)pbVar22);
      archive_strncat(as,pbVar22,sVar7);
    }
    break;
  case 0x6d:
    iVar3 = strcmp((char *)pbVar17,"mtime");
    if (iVar3 == 0) {
      pax_time((char *)pbVar22,&s,&local_68);
      archive_entry_set_mtime(entry,s,local_68);
    }
    break;
  case 0x70:
    iVar3 = strcmp((char *)pbVar17,"path");
    if (iVar3 == 0) {
      (tar->entry_pathname).length = 0;
      sVar7 = strlen((char *)pbVar22);
      archive_strncat(&tar->entry_pathname,pbVar22,sVar7);
    }
    break;
  case 0x73:
    iVar3 = strcmp((char *)pbVar17,"size");
    if (iVar3 == 0) {
      sVar7 = strlen((char *)pbVar22);
      iVar8 = tar_atol10((char *)pbVar22,sVar7);
      tar->entry_bytes_remaining = iVar8;
      if (iVar8 < 0) {
        pcVar16 = "Tar size attribute is negative";
      }
      else {
        if (iVar8 != 0x7fffffffffffffff) {
          wVar4 = L'\0';
          if (tar->realsize_override == 0) {
            archive_entry_set_size(entry,iVar8);
            wVar4 = L'\0';
            tar->realsize = tar->entry_bytes_remaining;
          }
          goto LAB_00156e91;
        }
        pcVar16 = "Tar size attribute overflow";
      }
      tar->entry_bytes_remaining = 0;
LAB_00157400:
      archive_set_error(&a->archive,-1,pcVar16);
      goto LAB_001573b2;
    }
    break;
  case 0x75:
    iVar3 = strcmp((char *)pbVar17,"uid");
    if (iVar3 == 0) {
      sVar7 = strlen((char *)pbVar22);
      iVar8 = tar_atol10((char *)pbVar22,sVar7);
      archive_entry_set_uid(entry,iVar8);
    }
    else {
      iVar3 = strcmp((char *)pbVar17,"uname");
      if (iVar3 == 0) {
        (tar->entry_uname).length = 0;
        sVar7 = strlen((char *)pbVar22);
        archive_strncat(local_48,pbVar22,sVar7);
      }
    }
LAB_00156d17:
    wVar4 = L'\0';
    goto LAB_00156e91;
  default:
    if (bVar18 == 0x53) {
      iVar3 = strcmp((char *)pbVar17,"SCHILY.acl.access");
      if (iVar3 == 0) {
        wVar4 = L'Ā';
      }
      else {
        iVar3 = strcmp((char *)pbVar17,"SCHILY.acl.default");
        if (iVar3 == 0) {
          wVar4 = L'Ȁ';
        }
        else {
          iVar3 = strcmp((char *)pbVar17,"SCHILY.acl.ace");
          if (iVar3 != 0) {
            iVar3 = strcmp((char *)pbVar17,"SCHILY.devmajor");
            if (iVar3 == 0) {
              sVar7 = strlen((char *)pbVar22);
              dVar10 = tar_atol10((char *)pbVar22,sVar7);
              archive_entry_set_rdevmajor(entry,dVar10);
            }
            else {
              iVar3 = strcmp((char *)pbVar17,"SCHILY.devminor");
              if (iVar3 == 0) {
                sVar7 = strlen((char *)pbVar22);
                dVar10 = tar_atol10((char *)pbVar22,sVar7);
                archive_entry_set_rdevminor(entry,dVar10);
              }
              else {
                iVar3 = strcmp((char *)pbVar17,"SCHILY.fflags");
                if (iVar3 == 0) {
                  archive_entry_copy_fflags_text(entry,(char *)pbVar22);
                }
                else {
                  iVar3 = strcmp((char *)pbVar17,"SCHILY.dev");
                  if (iVar3 == 0) {
                    sVar7 = strlen((char *)pbVar22);
                    dVar10 = tar_atol10((char *)pbVar22,sVar7);
                    archive_entry_set_dev(entry,dVar10);
                  }
                  else {
                    iVar3 = strcmp((char *)pbVar17,"SCHILY.ino");
                    if (iVar3 == 0) {
                      sVar7 = strlen((char *)pbVar22);
                      iVar8 = tar_atol10((char *)pbVar22,sVar7);
                      archive_entry_set_ino(entry,iVar8);
                    }
                    else {
                      iVar3 = strcmp((char *)pbVar17,"SCHILY.nlink");
                      if (iVar3 == 0) {
                        sVar7 = strlen((char *)pbVar22);
                        iVar8 = tar_atol10((char *)pbVar22,sVar7);
                        archive_entry_set_nlink(entry,(uint)iVar8);
                      }
                      else {
                        iVar3 = strcmp((char *)pbVar17,"SCHILY.realsize");
                        if (iVar3 == 0) {
                          sVar7 = strlen((char *)pbVar22);
                          iVar8 = tar_atol10((char *)pbVar22,sVar7);
                          tar->realsize = iVar8;
                          tar->realsize_override = 1;
                          archive_entry_set_size(entry,iVar8);
                        }
                        else {
                          iVar3 = strncmp((char *)pbVar17,"SCHILY.xattr.",0xd);
                          if (iVar3 == 0) {
                            sVar7 = strlen((char *)pbVar17);
                            if ((0xd < sVar7) &&
                               (iVar3 = bcmp(pbVar17,"SCHILY.xattr.",0xd), iVar3 == 0)) {
                              pbVar17 = pbVar17 + 0xd;
                              goto LAB_00156b18;
                            }
                          }
                          else {
                            iVar3 = strcmp((char *)pbVar17,"SUN.holesdata");
                            if (iVar3 == 0) {
                              if (*pbVar22 != 0x20) {
LAB_00157197:
                                archive_set_error(&a->archive,-1,"Parse error: SUN.holesdata");
LAB_00157002:
                                wVar4 = L'\xffffffec';
                                goto LAB_00156e91;
                              }
                              local_88 = (byte *)0x0;
                              uVar6 = 1;
                              do {
                                pbVar22 = pbVar22 + 1;
                                for (sVar21 = 0; bVar18 = pbVar22[sVar21], (bVar18 & 0xdf) != 0;
                                    sVar21 = sVar21 + 1) {
                                  if ((byte)(bVar18 - 0x3a) < 0xf6) goto LAB_00157197;
                                }
                                local_58 = (byte *)tar_atol10((char *)pbVar22,sVar21);
                                if ((long)local_58 < 0) goto LAB_00157197;
                                pbVar22 = pbVar22 + sVar21;
                                if ((long)local_58 - (long)local_88 != 0 &&
                                    (long)local_88 <= (long)local_58) {
                                  wVar4 = gnu_add_sparse_entry
                                                    (a,tar,(int64_t)local_88,
                                                     (long)local_58 - (long)local_88);
                                  if (wVar4 != L'\0') goto LAB_001573b2;
                                  tar->sparse_last->hole = uVar6;
                                  bVar18 = *pbVar22;
                                }
                                uVar6 = uVar6 ^ 1;
                                local_88 = local_58;
                              } while (bVar18 != 0);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            break;
          }
          wVar4 = L'㰀';
        }
      }
      wVar5 = pax_attribute_acl(a,tar,entry,(char *)pbVar22,wVar4);
      wVar4 = L'\0';
      if (wVar5 != L'\xffffffe2') goto LAB_00156e91;
      goto LAB_001573b2;
    }
    if (bVar18 == 0x4c) {
      iVar3 = strcmp((char *)pbVar17,"LIBARCHIVE.creationtime");
      if (iVar3 == 0) {
        pax_time((char *)pbVar22,&s,&local_68);
        archive_entry_set_birthtime(entry,s,local_68);
      }
      iVar3 = strcmp((char *)pbVar17,"LIBARCHIVE.symlinktype");
      if (iVar3 == 0) {
        iVar3 = strcmp((char *)pbVar22,"file");
        wVar4 = L'\x01';
        if (iVar3 != 0) {
          iVar3 = strcmp((char *)pbVar22,"dir");
          wVar4 = L'\x02';
          if (iVar3 != 0) goto LAB_00156bd9;
        }
        archive_entry_set_symlink_type(entry,wVar4);
      }
LAB_00156bd9:
      iVar3 = bcmp(pbVar17,"LIBARCHIVE.xattr.",0x11);
      if (((iVar3 == 0) && (sVar7 = strlen((char *)pbVar17), 0x11 < sVar7)) &&
         (iVar3 = bcmp(pbVar17,"LIBARCHIVE.xattr.",0x11), iVar3 == 0)) {
        pbVar17 = pbVar17 + 0x11;
        sVar7 = strlen((char *)pbVar17);
        pbVar9 = (byte *)malloc(sVar7 + 1);
        pbVar20 = pbVar9;
        if (pbVar9 != (byte *)0x0) {
          do {
            local_40 = pbVar20;
            bVar18 = *pbVar17;
            if (bVar18 == 0x25) {
              if ((pbVar17[1] == 0) || (bVar1 = pbVar17[2], bVar1 == 0)) goto LAB_00156cbb;
              local_58 = pbVar9;
              wVar4 = tohex((int)(char)pbVar17[1]);
              wVar5 = tohex((int)(char)bVar1);
              pbVar9 = local_58;
              if ((wVar4 | wVar5) < 0) goto LAB_00156cbb;
              pbVar17 = pbVar17 + 3;
              bVar18 = (byte)(wVar4 << 4) | (byte)wVar5;
            }
            else {
              if (bVar18 == 0) goto LAB_00156ef2;
LAB_00156cbb:
              pbVar17 = pbVar17 + 1;
            }
            *pbVar9 = bVar18;
            pbVar9 = pbVar9 + 1;
            pbVar20 = local_40;
          } while( true );
        }
        goto LAB_00156d17;
      }
    }
    else {
      if (bVar18 == 0x52) {
        iVar3 = strcmp((char *)pbVar17,"RHT.security.selinux");
        if (iVar3 == 0) {
          pbVar17 = (byte *)0x22d1c4;
LAB_00156b18:
          archive_entry_xattr_add_entry(entry,(char *)pbVar17,pbVar22,(size_t)pbVar20);
        }
        break;
      }
      if (bVar18 != 0x47) goto switchD_00156318_caseD_62;
      iVar3 = strncmp((char *)pbVar17,"GNU.sparse",10);
      if ((iVar3 == 0) && (tar->sparse_allowed == 0)) {
        pcVar16 = "Non-regular file cannot be sparse";
        goto LAB_00157400;
      }
      iVar3 = strcmp((char *)pbVar17,"GNU.sparse.numblocks");
      if (iVar3 == 0) {
        *(undefined4 *)local_50 = 0xffffffff;
        *(undefined4 *)((long)local_50 + 4) = 0xffffffff;
        *(undefined4 *)(local_50 + 1) = 0xffffffff;
        *(undefined4 *)((long)local_50 + 0xc) = 0xffffffff;
        tar->sparse_gnu_major = 0;
        tar->sparse_gnu_minor = 0;
      }
      iVar3 = strcmp((char *)pbVar17,"GNU.sparse.offset");
      if (iVar3 == 0) {
        sVar7 = strlen((char *)pbVar22);
        iVar8 = tar_atol10((char *)pbVar22,sVar7);
        tar->sparse_offset = iVar8;
        if (tar->sparse_numbytes != -1) {
          wVar4 = gnu_add_sparse_entry(a,tar,iVar8,tar->sparse_numbytes);
          if (wVar4 != L'\0') goto LAB_001573b2;
          *(undefined4 *)local_50 = 0xffffffff;
          *(undefined4 *)((long)local_50 + 4) = 0xffffffff;
          *(undefined4 *)(local_50 + 1) = 0xffffffff;
          *(undefined4 *)((long)local_50 + 0xc) = 0xffffffff;
        }
      }
      iVar3 = strcmp((char *)pbVar17,"GNU.sparse.numbytes");
      if (iVar3 == 0) {
        sVar7 = strlen((char *)pbVar22);
        iVar8 = tar_atol10((char *)pbVar22,sVar7);
        tar->sparse_numbytes = iVar8;
        if (tar->sparse_offset != -1) {
          wVar4 = gnu_add_sparse_entry(a,tar,tar->sparse_offset,iVar8);
          if (wVar4 != L'\0') goto LAB_001573b2;
          *(undefined4 *)local_50 = 0xffffffff;
          *(undefined4 *)((long)local_50 + 4) = 0xffffffff;
          *(undefined4 *)(local_50 + 1) = 0xffffffff;
          *(undefined4 *)((long)local_50 + 0xc) = 0xffffffff;
        }
      }
      iVar3 = strcmp((char *)pbVar17,"GNU.sparse.size");
      if (iVar3 == 0) {
        sVar7 = strlen((char *)pbVar22);
        iVar8 = tar_atol10((char *)pbVar22,sVar7);
        tar->realsize = iVar8;
        archive_entry_set_size(entry,iVar8);
        tar->realsize_override = 1;
      }
      iVar3 = strcmp((char *)pbVar17,"GNU.sparse.map");
      if (iVar3 == 0) {
        tar->sparse_gnu_major = 0;
        tar->sparse_gnu_minor = 1;
        pbVar9 = (byte *)0xffffffffffffffff;
        pbVar20 = pbVar22;
        do {
          for (sVar21 = 0; (bVar18 = pbVar20[sVar21], bVar18 != 0 && (bVar18 != 0x2c));
              sVar21 = sVar21 + 1) {
            if ((byte)(bVar18 - 0x3a) < 0xf6) {
              wVar4 = L'\xffffffec';
              goto LAB_00156e91;
            }
          }
          local_58 = pbVar9;
          pbVar9 = (byte *)tar_atol10((char *)pbVar20,sVar21);
          if ((long)local_58 < 0) {
            if ((long)pbVar9 < 0) goto LAB_00157002;
          }
          else {
            if (((long)pbVar9 < 0) ||
               (wVar4 = gnu_add_sparse_entry(a,tar,(int64_t)local_58,(int64_t)pbVar9),
               wVar4 != L'\0')) goto LAB_00157002;
            bVar18 = pbVar20[sVar21];
            pbVar9 = (byte *)0xffffffffffffffff;
          }
          pbVar20 = pbVar20 + sVar21 + 1;
        } while (bVar18 != 0);
      }
      iVar3 = strcmp((char *)pbVar17,"GNU.sparse.major");
      if (iVar3 == 0) {
        sVar7 = strlen((char *)pbVar22);
        iVar8 = tar_atol10((char *)pbVar22,sVar7);
        tar->sparse_gnu_major = (int)iVar8;
        tar->sparse_gnu_pending = '\x01';
      }
      iVar3 = strcmp((char *)pbVar17,"GNU.sparse.minor");
      if (iVar3 == 0) {
        sVar7 = strlen((char *)pbVar22);
        iVar8 = tar_atol10((char *)pbVar22,sVar7);
        tar->sparse_gnu_minor = (int)iVar8;
        tar->sparse_gnu_pending = '\x01';
      }
      iVar3 = strcmp((char *)pbVar17,"GNU.sparse.name");
      if (iVar3 == 0) {
        (tar->entry_pathname_override).length = 0;
        sVar7 = strlen((char *)pbVar22);
        archive_strncat(local_38,pbVar22,sVar7);
      }
      iVar3 = strcmp((char *)pbVar17,"GNU.sparse.realsize");
      if (iVar3 == 0) {
        sVar7 = strlen((char *)pbVar22);
        iVar8 = tar_atol10((char *)pbVar22,sVar7);
        tar->realsize = iVar8;
        archive_entry_set_size(entry,iVar8);
        tar->realsize_override = 1;
      }
    }
  }
LAB_00156b37:
  wVar4 = L'\0';
LAB_00156e91:
  pbVar19 = pbVar19 + uVar23;
  if (wVar4 <= local_b4) {
    local_b4 = wVar4;
  }
  uVar14 = uVar14 - uVar23;
  goto LAB_00156220;
LAB_00156ef2:
  *pbVar9 = 0;
  sVar7 = strlen((char *)pbVar22);
  if (base64_decode_decode_table[0x42] != '\x01') {
    base64_decode_decode_table._112_4_ = 0xffffffff;
    base64_decode_decode_table._116_4_ = 0xffffffff;
    base64_decode_decode_table._120_4_ = 0xffffffff;
    base64_decode_decode_table._124_4_ = 0xffffffff;
    base64_decode_decode_table._96_4_ = 0xffffffff;
    base64_decode_decode_table._100_4_ = 0xffffffff;
    base64_decode_decode_table._104_4_ = 0xffffffff;
    base64_decode_decode_table._108_4_ = 0xffffffff;
    base64_decode_decode_table._80_4_ = 0xffffffff;
    base64_decode_decode_table._84_4_ = 0xffffffff;
    base64_decode_decode_table._88_4_ = 0xffffffff;
    base64_decode_decode_table._92_4_ = 0xffffffff;
    base64_decode_decode_table._64_4_ = 0xffffffff;
    base64_decode_decode_table._68_4_ = 0xffffffff;
    base64_decode_decode_table._72_4_ = 0xffffffff;
    base64_decode_decode_table._76_4_ = 0xffffffff;
    base64_decode_decode_table._48_4_ = 0xffffffff;
    base64_decode_decode_table._52_4_ = 0xffffffff;
    base64_decode_decode_table._56_4_ = 0xffffffff;
    base64_decode_decode_table._60_4_ = 0xffffffff;
    base64_decode_decode_table._32_4_ = 0xffffffff;
    base64_decode_decode_table._36_4_ = 0xffffffff;
    base64_decode_decode_table._40_4_ = 0xffffffff;
    base64_decode_decode_table._44_4_ = 0xffffffff;
    base64_decode_decode_table._16_4_ = 0xffffffff;
    base64_decode_decode_table._20_4_ = 0xffffffff;
    base64_decode_decode_table._24_4_ = 0xffffffff;
    base64_decode_decode_table._28_4_ = 0xffffffff;
    base64_decode_decode_table._0_4_ = 0xffffffff;
    base64_decode_decode_table._4_4_ = 0xffffffff;
    base64_decode_decode_table._8_4_ = 0xffffffff;
    base64_decode_decode_table._12_4_ = 0xffffffff;
    for (lVar11 = 0; lVar11 != 0x40; lVar11 = lVar11 + 1) {
      base64_decode_decode_table[(byte)(&base64_decode_digits)[lVar11]] = (char)lVar11;
    }
  }
  pbVar20 = (byte *)malloc((sVar7 - (sVar7 >> 2)) + 1);
  pbVar9 = local_40;
  pbVar17 = pbVar20;
  if (pbVar20 != (byte *)0x0) {
    while (sVar7 != 0) {
      uVar15 = 0;
      uVar6 = 0;
      while( true ) {
        if ((3 < uVar6) || (sVar7 == 0)) goto LAB_00156fb1;
        bVar18 = *pbVar22;
        if ((bVar18 == 0x3d) || (bVar18 == 0x5f)) break;
        if (((char)bVar18 < ' ') || ((byte)base64_decode_decode_table[bVar18] == 0xff)) {
          pbVar22 = pbVar22 + 1;
          sVar7 = sVar7 - 1;
        }
        else {
          pbVar22 = pbVar22 + 1;
          uVar15 = uVar15 << 6 | (uint)(byte)base64_decode_decode_table[bVar18];
          sVar7 = sVar7 - 1;
          uVar6 = uVar6 + 1;
        }
      }
      sVar7 = 0;
LAB_00156fb1:
      iVar3 = uVar15 << (('\x04' - (char)uVar6) * '\x06' & 0x1fU);
      if (uVar6 == 2) {
LAB_00156fd5:
        *pbVar17 = (byte)((uint)iVar3 >> 0x10);
      }
      else {
        if (uVar6 == 3) {
LAB_00156fd2:
          pbVar17[1] = (byte)((uint)iVar3 >> 8);
          goto LAB_00156fd5;
        }
        if (uVar6 == 4) {
          pbVar17[2] = (byte)iVar3;
          goto LAB_00156fd2;
        }
      }
      pbVar17 = pbVar17 + (uVar6 * 3 >> 2);
    }
    archive_entry_xattr_add_entry(entry,(char *)local_40,pbVar20,(long)pbVar17 - (long)pbVar20);
    free(pbVar9);
    pbVar9 = pbVar20;
  }
  free(pbVar9);
  goto LAB_00156b37;
LAB_00157215:
  if (tar->pax_hdrcharset_binary == 0) {
    sc = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
    if (sc != (archive_string_conv *)0x0) {
      if (tar->compat_2x != 0) {
        archive_string_conversion_set_opt(sc,L'\x01');
      }
      goto LAB_00157284;
    }
  }
  else {
    sc = tar->opt_sconv;
LAB_00157284:
    sVar21 = (tar->entry_gname).length;
    if ((sVar21 != 0) &&
       (wVar4 = _archive_entry_copy_gname_l(entry,paVar12->s,sVar21,sc), wVar4 != L'\0')) {
      local_b4 = set_conversion_failed_error(a,sc,"Gname");
      if (local_b4 == L'\xffffffe2') goto LAB_001573b2;
      archive_entry_copy_gname(entry,paVar12->s);
    }
    sVar21 = (tar->entry_linkpath).length;
    if ((sVar21 != 0) && (wVar4 = _archive_entry_copy_link_l(entry,as->s,sVar21,sc), wVar4 != L'\0')
       ) {
      local_b4 = set_conversion_failed_error(a,sc,"Linkname");
      if (local_b4 == L'\xffffffe2') goto LAB_001573b2;
      archive_entry_copy_link(entry,as->s);
    }
    paVar12 = local_38;
    if ((((tar->entry_pathname_override).length != 0) ||
        (paVar12 = &tar->entry_pathname, (tar->entry_pathname).length != 0)) &&
       (wVar4 = _archive_entry_copy_pathname_l(entry,paVar12->s,paVar12->length,sc), wVar4 != L'\0')
       ) {
      local_b4 = set_conversion_failed_error(a,sc,"Pathname");
      if (local_b4 == L'\xffffffe2') goto LAB_001573b2;
      archive_entry_copy_pathname(entry,paVar12->s);
    }
    sVar21 = (tar->entry_uname).length;
    if ((sVar21 == 0) ||
       (wVar4 = _archive_entry_copy_uname_l(entry,local_48->s,sVar21,sc), wVar4 == L'\0'))
    goto LAB_001571e9;
    local_b4 = set_conversion_failed_error(a,sc,"Uname");
    if (local_b4 != L'\xffffffe2') {
      archive_entry_copy_uname(entry,local_48->s);
      goto LAB_001571e9;
    }
  }
LAB_001573b2:
  local_b4 = L'\xffffffe2';
LAB_001571e9:
  if (wVar2 < local_b4) {
    local_b4 = wVar2;
  }
  tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
  return local_b4;
}

Assistant:

static int
header_pax_extensions(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	int err, err2;

	err = read_body_to_string(a, tar, &(tar->pax_header), h, unconsumed);
	if (err != ARCHIVE_OK)
		return (err);

	/* Parse the next header. */
	err = tar_read_header(a, tar, entry, unconsumed);
	if ((err != ARCHIVE_OK) && (err != ARCHIVE_WARN))
		return (err);

	/*
	 * TODO: Parse global/default options into 'entry' struct here
	 * before handling file-specific options.
	 *
	 * This design (parse standard header, then overwrite with pax
	 * extended attribute data) usually works well, but isn't ideal;
	 * it would be better to parse the pax extended attributes first
	 * and then skip any fields in the standard header that were
	 * defined in the pax header.
	 */
	err2 = pax_header(a, tar, entry, &tar->pax_header);
	err =  err_combine(err, err2);
	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);
	return (err);
}